

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintGates(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  uint fUseLibrary;
  char *pcVar2;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fUseLibrary = 1;
  while (iVar1 = Extra_UtilGetopt(argc,argv,"lh"), iVar1 == 0x6c) {
    fUseLibrary = fUseLibrary ^ 1;
  }
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar2 = "Empty network.\n";
    }
    else {
      if (pNtk->ntkFunc != ABC_FUNC_AIG) {
        Abc_NtkPrintGates(pNtk,fUseLibrary);
        return 0;
      }
      pcVar2 = "Printing gates does not work for AIGs and sequential AIGs.\n";
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: print_gates [-lh]\n");
    Abc_Print(-2,"\t        prints statistics about gates used in the network\n");
    pcVar2 = "yes";
    if (fUseLibrary == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-l    : used library gate names (if mapped) [default = %s]\n",pcVar2);
    pcVar2 = "\t-h    : print the command usage\n";
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandPrintGates( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseLibrary;

    extern void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary );

    // set defaults
    fUseLibrary = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUseLibrary ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkHasAig(pNtk) )
    {
        Abc_Print( -1, "Printing gates does not work for AIGs and sequential AIGs.\n" );
        return 1;
    }

    Abc_NtkPrintGates( pNtk, fUseLibrary );
    return 0;

usage:
    Abc_Print( -2, "usage: print_gates [-lh]\n" );
    Abc_Print( -2, "\t        prints statistics about gates used in the network\n" );
    Abc_Print( -2, "\t-l    : used library gate names (if mapped) [default = %s]\n", fUseLibrary? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}